

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceInfoLinCWrapper.cpp
# Opt level: O1

int GmmDeviceCallback(GMM_CLIENT ClientType,GMM_DEVICE_CALLBACKS_INT *pDeviceCb,
                     GMM_DDI_ALLOCATE *pAllocate)

{
  int iVar1;
  void *local_40;
  void *pBo;
  void *pCpuAddr;
  uint64_t gpuAddr;
  
  local_40 = (void *)0x0;
  pBo = (void *)0x0;
  pCpuAddr = (void *)0x0;
  iVar1 = (*(pDeviceCb->DevCbPtrs_).pfnAllocate)
                    (pDeviceCb->pBufMgr,pAllocate->size,pAllocate->alignment,&local_40,&pBo,
                     (uint64_t *)&pCpuAddr);
  pAllocate->bo = local_40;
  pAllocate->cpuAddr = pBo;
  pAllocate->gfxAddr = (uint64_t)pCpuAddr;
  return iVar1;
}

Assistant:

int GmmDeviceCallback(GMM_CLIENT ClientType, GMM_DEVICE_CALLBACKS_INT *pDeviceCb, GMM_DDI_ALLOCATE *pAllocate)
{
    int      Status   = 0;
    void *   pBo      = NULL;
    void *   pCpuAddr = NULL;
    uint64_t gpuAddr  = 0ULL;

    Status = pDeviceCb->DevCbPtrs_.pfnAllocate(pDeviceCb->pBufMgr,
                                               pAllocate->size,
                                               pAllocate->alignment,
                                               &pBo,
                                               &pCpuAddr,
                                               &gpuAddr);
    pAllocate->bo      = pBo;
    pAllocate->cpuAddr = pCpuAddr;
    pAllocate->gfxAddr = gpuAddr;

    return Status;
}